

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<4,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uVar25;
  ulong *puVar26;
  byte bVar27;
  uint uVar28;
  AABBNodeMB4D *node1;
  ulong uVar29;
  uint uVar30;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined4 uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  float fVar86;
  float fVar89;
  float fVar90;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  uint local_11a0;
  undefined1 local_1199;
  ulong local_1198;
  Geometry *local_1190;
  RayQueryContext *local_1188;
  RTCIntersectArguments *local_1180;
  ulong local_1178;
  long local_1170;
  int local_1164;
  ulong local_1160;
  ulong local_1158;
  Scene *local_1150;
  long local_1148;
  long local_1140;
  RTCFilterFunctionNArguments local_1138;
  float local_1108;
  undefined4 local_1104;
  undefined4 local_1100;
  undefined4 local_10fc;
  undefined4 local_10f8;
  undefined4 local_10f4;
  uint local_10f0;
  uint local_10ec;
  uint local_10e8;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 *local_1038;
  byte local_1030;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  float local_fd8 [4];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  ulong local_f78;
  undefined4 uStack_f70;
  ulong local_f68 [487];
  ulong uVar31;
  
  local_f78 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    puVar26 = local_f68;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar44 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar86 = (ray->super_RayK<1>).tfar;
    auVar75 = ZEXT464((uint)fVar86);
    auVar40._8_4_ = 0x7fffffff;
    auVar40._0_8_ = 0x7fffffff7fffffff;
    auVar40._12_4_ = 0x7fffffff;
    auVar40 = vandps_avx512vl((undefined1  [16])aVar2,auVar40);
    auVar41._8_4_ = 0x219392ef;
    auVar41._0_8_ = 0x219392ef219392ef;
    auVar41._12_4_ = 0x219392ef;
    uVar34 = vcmpps_avx512vl(auVar40,auVar41,1);
    uStack_f70 = 0;
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar97 = ZEXT1664(auVar40);
    auVar40 = vdivps_avx512vl(auVar40,(undefined1  [16])aVar2);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar5 = (bool)((byte)uVar34 & 1);
    auVar53._0_4_ = (uint)bVar5 * auVar41._0_4_ | (uint)!bVar5 * auVar40._0_4_;
    bVar5 = (bool)((byte)(uVar34 >> 1) & 1);
    auVar53._4_4_ = (uint)bVar5 * auVar41._4_4_ | (uint)!bVar5 * auVar40._4_4_;
    bVar5 = (bool)((byte)(uVar34 >> 2) & 1);
    auVar53._8_4_ = (uint)bVar5 * auVar41._8_4_ | (uint)!bVar5 * auVar40._8_4_;
    bVar5 = (bool)((byte)(uVar34 >> 3) & 1);
    auVar53._12_4_ = (uint)bVar5 * auVar41._12_4_ | (uint)!bVar5 * auVar40._12_4_;
    auVar61._8_4_ = 0x3f7ffffa;
    auVar61._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar61._12_4_ = 0x3f7ffffa;
    auVar42 = vmulps_avx512vl(auVar53,auVar61);
    auVar43._8_4_ = 0x3f800003;
    auVar43._0_8_ = 0x3f8000033f800003;
    auVar43._12_4_ = 0x3f800003;
    auVar43 = vmulps_avx512vl(auVar53,auVar43);
    local_1088 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar98 = ZEXT1664(local_1088);
    auVar40 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar86));
    local_1098 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar99 = ZEXT1664(local_1098);
    local_10a8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar100 = ZEXT1664(local_10a8);
    local_10b8 = vbroadcastss_avx512vl(auVar42);
    auVar101 = ZEXT1664(local_10b8);
    auVar41 = vmovshdup_avx(auVar42);
    local_10c8 = vshufps_avx512vl(auVar42,auVar42,0x55);
    auVar102 = ZEXT1664(local_10c8);
    auVar61 = vshufpd_avx(auVar42,auVar42,1);
    local_f88 = vshufps_avx(auVar42,auVar42,0xaa);
    auVar85 = ZEXT1664(local_f88);
    fVar67 = auVar43._0_4_;
    local_fa8 = vshufps_avx(auVar43,auVar43,0x55);
    auVar91 = ZEXT1664(local_fa8);
    local_fb8 = vshufps_avx(auVar43,auVar43,0xaa);
    auVar95 = ZEXT1664(local_fb8);
    uVar35 = (ulong)(auVar42._0_4_ < 0.0) << 4;
    uVar36 = (ulong)(auVar41._0_4_ < 0.0) << 4 | 0x20;
    uVar34 = (ulong)(auVar61._0_4_ < 0.0) << 4 | 0x40;
    uVar37 = uVar35 ^ 0x10;
    uVar38 = uVar36 ^ 0x10;
    uVar32 = uVar34 ^ 0x10;
    uVar76 = auVar44._0_4_;
    local_fc8._4_4_ = uVar76;
    local_fc8._0_4_ = uVar76;
    local_fc8._8_4_ = uVar76;
    local_fc8._12_4_ = uVar76;
    auVar96 = ZEXT1664(local_fc8);
    uVar76 = auVar40._0_4_;
    auVar74 = ZEXT1664(CONCAT412(uVar76,CONCAT48(uVar76,CONCAT44(uVar76,uVar76))));
    local_1158 = uVar35;
    local_f98 = fVar67;
    fStack_f94 = fVar67;
    fStack_f90 = fVar67;
    fStack_f8c = fVar67;
    local_1160 = uVar36;
    local_1188 = context;
    local_1198 = uVar34;
    fVar90 = fVar67;
    fVar89 = fVar67;
    fVar86 = fVar67;
LAB_01ea6f14:
    do {
      pfVar1 = (float *)(puVar26 + -1);
      puVar26 = puVar26 + -2;
      if (*pfVar1 <= auVar75._0_4_) {
        uVar39 = *puVar26;
        while ((uVar39 & 8) == 0) {
          uVar29 = uVar39 & 0xfffffffffffffff0;
          uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar42._4_4_ = uVar76;
          auVar42._0_4_ = uVar76;
          auVar42._8_4_ = uVar76;
          auVar42._12_4_ = uVar76;
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar35),auVar42,
                                    *(undefined1 (*) [16])(uVar29 + 0x20 + uVar35));
          auVar44 = vsubps_avx512vl(auVar44,auVar98._0_16_);
          auVar44 = vmulps_avx512vl(auVar101._0_16_,auVar44);
          auVar44 = vmaxps_avx(auVar96._0_16_,auVar44);
          auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar36),auVar42,
                                    *(undefined1 (*) [16])(uVar29 + 0x20 + uVar36));
          auVar40 = vsubps_avx512vl(auVar40,auVar99._0_16_);
          auVar41 = vmulps_avx512vl(auVar102._0_16_,auVar40);
          auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar34),auVar42,
                                    *(undefined1 (*) [16])(uVar29 + 0x20 + uVar34));
          auVar40 = vsubps_avx512vl(auVar40,auVar100._0_16_);
          auVar55._0_4_ = auVar85._0_4_ * auVar40._0_4_;
          auVar55._4_4_ = auVar85._4_4_ * auVar40._4_4_;
          auVar55._8_4_ = auVar85._8_4_ * auVar40._8_4_;
          auVar55._12_4_ = auVar85._12_4_ * auVar40._12_4_;
          auVar40 = vmaxps_avx(auVar41,auVar55);
          local_1068 = vmaxps_avx(auVar44,auVar40);
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar37),auVar42,
                                    *(undefined1 (*) [16])(uVar29 + 0x20 + uVar37));
          auVar44 = vsubps_avx512vl(auVar44,auVar98._0_16_);
          auVar54._0_4_ = fVar86 * auVar44._0_4_;
          auVar54._4_4_ = fVar89 * auVar44._4_4_;
          auVar54._8_4_ = fVar90 * auVar44._8_4_;
          auVar54._12_4_ = fVar67 * auVar44._12_4_;
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar38),auVar42,
                                    *(undefined1 (*) [16])(uVar29 + 0x20 + uVar38));
          auVar44 = vsubps_avx512vl(auVar44,auVar99._0_16_);
          auVar48._0_4_ = auVar91._0_4_ * auVar44._0_4_;
          auVar48._4_4_ = auVar91._4_4_ * auVar44._4_4_;
          auVar48._8_4_ = auVar91._8_4_ * auVar44._8_4_;
          auVar48._12_4_ = auVar91._12_4_ * auVar44._12_4_;
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar32),auVar42,
                                    *(undefined1 (*) [16])(uVar29 + 0x20 + uVar32));
          auVar44 = vsubps_avx512vl(auVar44,auVar100._0_16_);
          auVar49._0_4_ = auVar95._0_4_ * auVar44._0_4_;
          auVar49._4_4_ = auVar95._4_4_ * auVar44._4_4_;
          auVar49._8_4_ = auVar95._8_4_ * auVar44._8_4_;
          auVar49._12_4_ = auVar95._12_4_ * auVar44._12_4_;
          auVar44 = vminps_avx(auVar48,auVar49);
          auVar40 = vminps_avx(auVar74._0_16_,auVar54);
          auVar44 = vminps_avx(auVar40,auVar44);
          uVar13 = vcmpps_avx512vl(local_1068,auVar44,2);
          uVar30 = (uint)uVar13;
          if (((uint)uVar39 & 7) == 6) {
            uVar14 = vcmpps_avx512vl(auVar42,*(undefined1 (*) [16])(uVar29 + 0xf0),1);
            uVar15 = vcmpps_avx512vl(auVar42,*(undefined1 (*) [16])(uVar29 + 0xe0),0xd);
            uVar30 = (uint)(byte)((byte)uVar14 & (byte)uVar15 & (byte)uVar13);
          }
          if ((byte)uVar30 == 0) {
            auVar44 = vmovshdup_avx(*(undefined1 (*) [16])
                                     ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc));
            auVar75 = ZEXT1664(auVar44);
            if (puVar26 == &local_f78) {
              return;
            }
            goto LAB_01ea6f14;
          }
          lVar16 = 0;
          for (uVar39 = (ulong)(byte)uVar30; (uVar39 & 1) == 0;
              uVar39 = uVar39 >> 1 | 0x8000000000000000) {
            lVar16 = lVar16 + 1;
          }
          uVar39 = *(ulong *)(uVar29 + lVar16 * 8);
          uVar30 = (uVar30 & 0xff) - 1 & uVar30 & 0xff;
          uVar31 = (ulong)uVar30;
          if (uVar30 != 0) {
            uVar28 = *(uint *)(local_1068 + lVar16 * 4);
            lVar16 = 0;
            for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
            uVar30 = uVar30 - 1 & uVar30;
            uVar33 = (ulong)uVar30;
            uVar31 = *(ulong *)(uVar29 + lVar16 * 8);
            uVar25 = *(uint *)(local_1068 + lVar16 * 4);
            uVar34 = local_1198;
            if (uVar30 == 0) {
              if (uVar28 < uVar25) {
                *puVar26 = uVar31;
                *(uint *)(puVar26 + 1) = uVar25;
                puVar26 = puVar26 + 2;
              }
              else {
                *puVar26 = uVar39;
                *(uint *)(puVar26 + 1) = uVar28;
                puVar26 = puVar26 + 2;
                uVar39 = uVar31;
              }
            }
            else {
              auVar44._8_8_ = 0;
              auVar44._0_8_ = uVar39;
              auVar44 = vpunpcklqdq_avx(auVar44,ZEXT416(uVar28));
              auVar50._8_8_ = 0;
              auVar50._0_8_ = uVar31;
              auVar40 = vpunpcklqdq_avx(auVar50,ZEXT416(uVar25));
              lVar16 = 0;
              for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                lVar16 = lVar16 + 1;
              }
              uVar30 = uVar30 - 1 & uVar30;
              uVar39 = (ulong)uVar30;
              auVar51._8_8_ = 0;
              auVar51._0_8_ = *(ulong *)(uVar29 + lVar16 * 8);
              auVar53 = vpunpcklqdq_avx(auVar51,ZEXT416(*(uint *)(local_1068 + lVar16 * 4)));
              auVar41 = vpshufd_avx(auVar44,0xaa);
              auVar61 = vpshufd_avx(auVar40,0xaa);
              auVar43 = vpshufd_avx(auVar53,0xaa);
              if (uVar30 == 0) {
                uVar39 = vpcmpgtd_avx512vl(auVar61,auVar41);
                uVar39 = uVar39 & 0xf;
                auVar61 = vpblendmd_avx512vl(auVar40,auVar44);
                bVar5 = (bool)((byte)uVar39 & 1);
                auVar45._0_4_ = (uint)bVar5 * auVar61._0_4_ | (uint)!bVar5 * auVar41._0_4_;
                bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar45._4_4_ = (uint)bVar5 * auVar61._4_4_ | (uint)!bVar5 * auVar41._4_4_;
                bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar45._8_4_ = (uint)bVar5 * auVar61._8_4_ | (uint)!bVar5 * auVar41._8_4_;
                bVar5 = SUB81(uVar39 >> 3,0);
                auVar45._12_4_ = (uint)bVar5 * auVar61._12_4_ | (uint)!bVar5 * auVar41._12_4_;
                auVar40 = vmovdqa32_avx512vl(auVar40);
                bVar5 = (bool)((byte)uVar39 & 1);
                auVar46._0_4_ = (uint)bVar5 * auVar40._0_4_ | (uint)!bVar5 * auVar44._0_4_;
                bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar46._4_4_ = (uint)bVar5 * auVar40._4_4_ | (uint)!bVar5 * auVar44._4_4_;
                bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar46._8_4_ = (uint)bVar5 * auVar40._8_4_ | (uint)!bVar5 * auVar44._8_4_;
                bVar5 = SUB81(uVar39 >> 3,0);
                auVar46._12_4_ = (uint)bVar5 * auVar40._12_4_ | (uint)!bVar5 * auVar44._12_4_;
                auVar44 = vpshufd_avx(auVar45,0xaa);
                uVar29 = vpcmpgtd_avx512vl(auVar43,auVar44);
                uVar29 = uVar29 & 0xf;
                auVar40 = vpblendmd_avx512vl(auVar53,auVar45);
                bVar5 = (bool)((byte)uVar29 & 1);
                bVar6 = (bool)((byte)(uVar29 >> 1) & 1);
                uVar39 = CONCAT44((uint)bVar6 * auVar40._4_4_ | (uint)!bVar6 * auVar44._4_4_,
                                  (uint)bVar5 * auVar40._0_4_ | (uint)!bVar5 * auVar44._0_4_);
                auVar44 = vmovdqa32_avx512vl(auVar53);
                bVar5 = (bool)((byte)uVar29 & 1);
                auVar47._0_4_ = (uint)bVar5 * auVar44._0_4_ | !bVar5 * auVar45._0_4_;
                bVar5 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar47._4_4_ = (uint)bVar5 * auVar44._4_4_ | !bVar5 * auVar45._4_4_;
                bVar5 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar47._8_4_ = (uint)bVar5 * auVar44._8_4_ | !bVar5 * auVar45._8_4_;
                bVar5 = SUB81(uVar29 >> 3,0);
                auVar47._12_4_ = (uint)bVar5 * auVar44._12_4_ | !bVar5 * auVar45._12_4_;
                auVar44 = vpshufd_avx(auVar47,0xaa);
                auVar40 = vpshufd_avx(auVar46,0xaa);
                uVar29 = vpcmpgtd_avx512vl(auVar44,auVar40);
                uVar29 = uVar29 & 0xf;
                auVar40 = vpblendmd_avx512vl(auVar47,auVar46);
                bVar5 = (bool)((byte)uVar29 & 1);
                bVar7 = (bool)((byte)(uVar29 >> 1) & 1);
                bVar9 = (bool)((byte)(uVar29 >> 2) & 1);
                bVar11 = SUB81(uVar29 >> 3,0);
                auVar41 = vmovdqa32_avx512vl(auVar47);
                bVar6 = (bool)((byte)uVar29 & 1);
                bVar8 = (bool)((byte)(uVar29 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
                bVar12 = SUB81(uVar29 >> 3,0);
                *(uint *)puVar26 = (uint)bVar6 * auVar41._0_4_ | !bVar6 * auVar46._0_4_;
                *(uint *)((long)puVar26 + 4) = (uint)bVar8 * auVar41._4_4_ | !bVar8 * auVar46._4_4_;
                *(uint *)(puVar26 + 1) = (uint)bVar10 * auVar41._8_4_ | !bVar10 * auVar46._8_4_;
                *(uint *)((long)puVar26 + 0xc) =
                     (uint)bVar12 * auVar41._12_4_ | !bVar12 * auVar46._12_4_;
                *(uint *)(puVar26 + 2) = (uint)bVar5 * auVar40._0_4_ | (uint)!bVar5 * auVar44._0_4_;
                *(uint *)((long)puVar26 + 0x14) =
                     (uint)bVar7 * auVar40._4_4_ | (uint)!bVar7 * auVar44._4_4_;
                *(uint *)(puVar26 + 3) = (uint)bVar9 * auVar40._8_4_ | (uint)!bVar9 * auVar44._8_4_;
                *(uint *)((long)puVar26 + 0x1c) =
                     (uint)bVar11 * auVar40._12_4_ | (uint)!bVar11 * auVar44._12_4_;
                puVar26 = puVar26 + 4;
              }
              else {
                lVar16 = 0;
                for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                  lVar16 = lVar16 + 1;
                }
                uVar30 = *(uint *)(local_1068 + lVar16 * 4);
                auVar80._8_8_ = 0;
                auVar80._0_8_ = *(ulong *)(uVar29 + lVar16 * 8);
                auVar42 = vpunpcklqdq_avx(auVar80,ZEXT416(uVar30));
                uVar39 = vpcmpgtd_avx512vl(auVar61,auVar41);
                uVar39 = uVar39 & 0xf;
                auVar61 = vpblendmd_avx512vl(auVar40,auVar44);
                bVar5 = (bool)((byte)uVar39 & 1);
                auVar52._0_4_ = (uint)bVar5 * auVar61._0_4_ | (uint)!bVar5 * auVar41._0_4_;
                bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar52._4_4_ = (uint)bVar5 * auVar61._4_4_ | (uint)!bVar5 * auVar41._4_4_;
                bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar52._8_4_ = (uint)bVar5 * auVar61._8_4_ | (uint)!bVar5 * auVar41._8_4_;
                bVar5 = SUB81(uVar39 >> 3,0);
                auVar52._12_4_ = (uint)bVar5 * auVar61._12_4_ | (uint)!bVar5 * auVar41._12_4_;
                auVar40 = vmovdqa32_avx512vl(auVar40);
                bVar5 = (bool)((byte)uVar39 & 1);
                auVar56._0_4_ = (uint)bVar5 * auVar40._0_4_ | (uint)!bVar5 * auVar44._0_4_;
                bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar56._4_4_ = (uint)bVar5 * auVar40._4_4_ | (uint)!bVar5 * auVar44._4_4_;
                bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar56._8_4_ = (uint)bVar5 * auVar40._8_4_ | (uint)!bVar5 * auVar44._8_4_;
                bVar5 = SUB81(uVar39 >> 3,0);
                auVar56._12_4_ = (uint)bVar5 * auVar40._12_4_ | (uint)!bVar5 * auVar44._12_4_;
                auVar64._4_4_ = uVar30;
                auVar64._0_4_ = uVar30;
                auVar64._8_4_ = uVar30;
                auVar64._12_4_ = uVar30;
                uVar39 = vpcmpgtd_avx512vl(auVar64,auVar43);
                uVar39 = uVar39 & 0xf;
                auVar44 = vpblendmd_avx512vl(auVar42,auVar53);
                bVar5 = (bool)((byte)uVar39 & 1);
                auVar57._0_4_ = (uint)bVar5 * auVar44._0_4_ | !bVar5 * uVar30;
                bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar57._4_4_ = (uint)bVar5 * auVar44._4_4_ | !bVar5 * uVar30;
                bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar57._8_4_ = (uint)bVar5 * auVar44._8_4_ | !bVar5 * uVar30;
                bVar5 = SUB81(uVar39 >> 3,0);
                auVar57._12_4_ = (uint)bVar5 * auVar44._12_4_ | !bVar5 * uVar30;
                auVar44 = vmovdqa32_avx512vl(auVar42);
                bVar5 = (bool)((byte)uVar39 & 1);
                auVar58._0_4_ = (uint)bVar5 * auVar44._0_4_ | (uint)!bVar5 * auVar53._0_4_;
                bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar58._4_4_ = (uint)bVar5 * auVar44._4_4_ | (uint)!bVar5 * auVar53._4_4_;
                bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar58._8_4_ = (uint)bVar5 * auVar44._8_4_ | (uint)!bVar5 * auVar53._8_4_;
                bVar5 = SUB81(uVar39 >> 3,0);
                auVar58._12_4_ = (uint)bVar5 * auVar44._12_4_ | (uint)!bVar5 * auVar53._12_4_;
                auVar44 = vpshufd_avx(auVar58,0xaa);
                auVar40 = vpshufd_avx(auVar56,0xaa);
                uVar39 = vpcmpgtd_avx512vl(auVar44,auVar40);
                uVar39 = uVar39 & 0xf;
                auVar40 = vpblendmd_avx512vl(auVar58,auVar56);
                bVar5 = (bool)((byte)uVar39 & 1);
                auVar59._0_4_ = (uint)bVar5 * auVar40._0_4_ | (uint)!bVar5 * auVar44._0_4_;
                bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar59._4_4_ = (uint)bVar5 * auVar40._4_4_ | (uint)!bVar5 * auVar44._4_4_;
                bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar59._8_4_ = (uint)bVar5 * auVar40._8_4_ | (uint)!bVar5 * auVar44._8_4_;
                bVar5 = SUB81(uVar39 >> 3,0);
                auVar59._12_4_ = (uint)bVar5 * auVar40._12_4_ | (uint)!bVar5 * auVar44._12_4_;
                auVar41 = vmovdqa32_avx512vl(auVar58);
                bVar5 = (bool)((byte)uVar39 & 1);
                bVar7 = (bool)((byte)(uVar39 >> 1) & 1);
                bVar9 = (bool)((byte)(uVar39 >> 2) & 1);
                bVar10 = SUB81(uVar39 >> 3,0);
                auVar44 = vpshufd_avx(auVar57,0xaa);
                auVar40 = vpshufd_avx(auVar52,0xaa);
                uVar29 = vpcmpgtd_avx512vl(auVar44,auVar40);
                uVar29 = uVar29 & 0xf;
                auVar40 = vpblendmd_avx512vl(auVar57,auVar52);
                bVar6 = (bool)((byte)uVar29 & 1);
                bVar8 = (bool)((byte)(uVar29 >> 1) & 1);
                uVar39 = CONCAT44((uint)bVar8 * auVar40._4_4_ | (uint)!bVar8 * auVar44._4_4_,
                                  (uint)bVar6 * auVar40._0_4_ | (uint)!bVar6 * auVar44._0_4_);
                auVar44 = vmovdqa32_avx512vl(auVar57);
                bVar6 = (bool)((byte)uVar29 & 1);
                auVar60._0_4_ = (uint)bVar6 * auVar44._0_4_ | !bVar6 * auVar52._0_4_;
                bVar6 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar60._4_4_ = (uint)bVar6 * auVar44._4_4_ | !bVar6 * auVar52._4_4_;
                bVar6 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar60._8_4_ = (uint)bVar6 * auVar44._8_4_ | !bVar6 * auVar52._8_4_;
                bVar6 = SUB81(uVar29 >> 3,0);
                auVar60._12_4_ = (uint)bVar6 * auVar44._12_4_ | !bVar6 * auVar52._12_4_;
                auVar44 = vpshufd_avx(auVar60,0xaa);
                auVar40 = vpshufd_avx(auVar59,0xaa);
                uVar29 = vpcmpgtd_avx512vl(auVar40,auVar44);
                uVar29 = uVar29 & 0xf;
                auVar40 = vpblendmd_avx512vl(auVar59,auVar60);
                bVar6 = (bool)((byte)uVar29 & 1);
                auVar62._0_4_ = (uint)bVar6 * auVar40._0_4_ | (uint)!bVar6 * auVar44._0_4_;
                bVar6 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar62._4_4_ = (uint)bVar6 * auVar40._4_4_ | (uint)!bVar6 * auVar44._4_4_;
                bVar6 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar62._8_4_ = (uint)bVar6 * auVar40._8_4_ | (uint)!bVar6 * auVar44._8_4_;
                bVar6 = SUB81(uVar29 >> 3,0);
                auVar62._12_4_ = (uint)bVar6 * auVar40._12_4_ | (uint)!bVar6 * auVar44._12_4_;
                auVar44 = vmovdqa32_avx512vl(auVar59);
                bVar6 = (bool)((byte)uVar29 & 1);
                auVar63._0_4_ = (uint)bVar6 * auVar44._0_4_ | !bVar6 * auVar60._0_4_;
                bVar6 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar63._4_4_ = (uint)bVar6 * auVar44._4_4_ | !bVar6 * auVar60._4_4_;
                bVar6 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar63._8_4_ = (uint)bVar6 * auVar44._8_4_ | !bVar6 * auVar60._8_4_;
                bVar6 = SUB81(uVar29 >> 3,0);
                auVar63._12_4_ = (uint)bVar6 * auVar44._12_4_ | !bVar6 * auVar60._12_4_;
                *(uint *)puVar26 = (uint)bVar5 * auVar41._0_4_ | !bVar5 * auVar56._0_4_;
                *(uint *)((long)puVar26 + 4) = (uint)bVar7 * auVar41._4_4_ | !bVar7 * auVar56._4_4_;
                *(uint *)(puVar26 + 1) = (uint)bVar9 * auVar41._8_4_ | !bVar9 * auVar56._8_4_;
                *(uint *)((long)puVar26 + 0xc) =
                     (uint)bVar10 * auVar41._12_4_ | !bVar10 * auVar56._12_4_;
                *(undefined1 (*) [16])(puVar26 + 2) = auVar63;
                *(undefined1 (*) [16])(puVar26 + 4) = auVar62;
                puVar26 = puVar26 + 6;
              }
            }
          }
        }
        local_1148 = (ulong)((uint)uVar39 & 0xf) - 8;
        if (local_1148 != 0) {
          uVar39 = uVar39 & 0xfffffffffffffff0;
          local_1140 = 0;
          do {
            local_1170 = local_1140 * 0x140;
            uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
            auVar68._4_4_ = uVar76;
            auVar68._0_4_ = uVar76;
            auVar68._8_4_ = uVar76;
            auVar68._12_4_ = uVar76;
            auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x90 + local_1170),auVar68,
                                      *(undefined1 (*) [16])(uVar39 + local_1170));
            auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xa0 + local_1170),auVar68,
                                      *(undefined1 (*) [16])(uVar39 + 0x10 + local_1170));
            auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xb0 + local_1170),auVar68,
                                      *(undefined1 (*) [16])(uVar39 + 0x20 + local_1170));
            auVar61 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xc0 + local_1170),auVar68,
                                      *(undefined1 (*) [16])(uVar39 + 0x30 + local_1170));
            auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xd0 + local_1170),auVar68,
                                      *(undefined1 (*) [16])(uVar39 + 0x40 + local_1170));
            auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xe0 + local_1170),auVar68,
                                      *(undefined1 (*) [16])(uVar39 + 0x50 + local_1170));
            auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0xf0 + local_1170),auVar68,
                                      *(undefined1 (*) [16])(uVar39 + 0x60 + local_1170));
            auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x100 + local_1170),auVar68,
                                      *(undefined1 (*) [16])(uVar39 + 0x70 + local_1170));
            auVar55 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x110 + local_1170),auVar68,
                                      *(undefined1 (*) [16])(uVar39 + 0x80 + local_1170));
            uVar76 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar69._4_4_ = uVar76;
            auVar69._0_4_ = uVar76;
            auVar69._8_4_ = uVar76;
            auVar69._12_4_ = uVar76;
            auVar48 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]))
            ;
            auVar49 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar76 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar81._4_4_ = uVar76;
            auVar81._0_4_ = uVar76;
            auVar81._8_4_ = uVar76;
            auVar81._12_4_ = uVar76;
            uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar83._4_4_ = uVar76;
            auVar83._0_4_ = uVar76;
            auVar83._8_4_ = uVar76;
            auVar83._12_4_ = uVar76;
            fVar86 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar87._4_4_ = fVar86;
            auVar87._0_4_ = fVar86;
            auVar87._8_4_ = fVar86;
            auVar87._12_4_ = fVar86;
            auVar44 = vsubps_avx(auVar44,auVar69);
            auVar50 = vsubps_avx512vl(auVar40,auVar48);
            auVar51 = vsubps_avx512vl(auVar41,auVar49);
            auVar52 = vsubps_avx512vl(auVar61,auVar69);
            auVar43 = vsubps_avx512vl(auVar43,auVar48);
            auVar53 = vsubps_avx512vl(auVar53,auVar49);
            auVar42 = vsubps_avx512vl(auVar42,auVar69);
            auVar54 = vsubps_avx512vl(auVar54,auVar48);
            auVar55 = vsubps_avx512vl(auVar55,auVar49);
            auVar48 = vsubps_avx512vl(auVar42,auVar44);
            auVar49 = vsubps_avx512vl(auVar54,auVar50);
            auVar40 = vsubps_avx(auVar55,auVar51);
            auVar56 = vsubps_avx512vl(auVar44,auVar52);
            auVar57 = vsubps_avx512vl(auVar50,auVar43);
            auVar58 = vsubps_avx512vl(auVar51,auVar53);
            auVar59 = vsubps_avx512vl(auVar52,auVar42);
            auVar60 = vsubps_avx512vl(auVar43,auVar54);
            auVar41 = vsubps_avx(auVar53,auVar55);
            auVar61 = vaddps_avx512vl(auVar42,auVar44);
            auVar62 = vaddps_avx512vl(auVar54,auVar50);
            auVar63 = vaddps_avx512vl(auVar55,auVar51);
            auVar64 = vmulps_avx512vl(auVar62,auVar40);
            auVar64 = vfmsub231ps_avx512vl(auVar64,auVar49,auVar63);
            auVar63 = vmulps_avx512vl(auVar63,auVar48);
            auVar63 = vfmsub231ps_avx512vl(auVar63,auVar40,auVar61);
            auVar77._0_4_ = auVar49._0_4_ * auVar61._0_4_;
            auVar77._4_4_ = auVar49._4_4_ * auVar61._4_4_;
            auVar77._8_4_ = auVar49._8_4_ * auVar61._8_4_;
            auVar77._12_4_ = auVar49._12_4_ * auVar61._12_4_;
            auVar61 = vfmsub231ps_fma(auVar77,auVar48,auVar62);
            auVar78._0_4_ = fVar86 * auVar61._0_4_;
            auVar78._4_4_ = fVar86 * auVar61._4_4_;
            auVar78._8_4_ = fVar86 * auVar61._8_4_;
            auVar78._12_4_ = fVar86 * auVar61._12_4_;
            auVar61 = vfmadd231ps_avx512vl(auVar78,auVar83,auVar63);
            local_1068 = vfmadd231ps_avx512vl(auVar61,auVar81,auVar64);
            auVar61 = vaddps_avx512vl(auVar44,auVar52);
            auVar62 = vaddps_avx512vl(auVar50,auVar43);
            auVar63 = vaddps_avx512vl(auVar51,auVar53);
            auVar64 = vmulps_avx512vl(auVar62,auVar58);
            auVar64 = vfmsub231ps_avx512vl(auVar64,auVar57,auVar63);
            auVar63 = vmulps_avx512vl(auVar63,auVar56);
            auVar63 = vfmsub231ps_avx512vl(auVar63,auVar58,auVar61);
            auVar61 = vmulps_avx512vl(auVar61,auVar57);
            auVar61 = vfmsub231ps_avx512vl(auVar61,auVar56,auVar62);
            auVar79._0_4_ = fVar86 * auVar61._0_4_;
            auVar79._4_4_ = fVar86 * auVar61._4_4_;
            auVar79._8_4_ = fVar86 * auVar61._8_4_;
            auVar79._12_4_ = fVar86 * auVar61._12_4_;
            auVar61 = vfmadd231ps_avx512vl(auVar79,auVar83,auVar63);
            local_1058 = vfmadd231ps_avx512vl(auVar61,auVar81,auVar64);
            auVar42 = vaddps_avx512vl(auVar52,auVar42);
            auVar43 = vaddps_avx512vl(auVar43,auVar54);
            auVar92._0_4_ = auVar53._0_4_ + auVar55._0_4_;
            auVar92._4_4_ = auVar53._4_4_ + auVar55._4_4_;
            auVar92._8_4_ = auVar53._8_4_ + auVar55._8_4_;
            auVar92._12_4_ = auVar53._12_4_ + auVar55._12_4_;
            auVar61 = vmulps_avx512vl(auVar43,auVar41);
            auVar61 = vfmsub231ps_fma(auVar61,auVar60,auVar92);
            auVar93._0_4_ = auVar92._0_4_ * auVar59._0_4_;
            auVar93._4_4_ = auVar92._4_4_ * auVar59._4_4_;
            auVar93._8_4_ = auVar92._8_4_ * auVar59._8_4_;
            auVar93._12_4_ = auVar92._12_4_ * auVar59._12_4_;
            auVar53 = vfmsub231ps_avx512vl(auVar93,auVar41,auVar42);
            auVar42 = vmulps_avx512vl(auVar42,auVar60);
            auVar43 = vfmsub231ps_avx512vl(auVar42,auVar59,auVar43);
            auVar43 = vmulps_avx512vl(auVar87,auVar43);
            auVar43 = vfmadd231ps_avx512vl(auVar43,auVar83,auVar53);
            auVar61 = vfmadd231ps_avx512vl(auVar43,auVar81,auVar61);
            auVar94._0_4_ = local_1068._0_4_ + local_1058._0_4_;
            auVar94._4_4_ = local_1068._4_4_ + local_1058._4_4_;
            auVar94._8_4_ = local_1068._8_4_ + local_1058._8_4_;
            auVar94._12_4_ = local_1068._12_4_ + local_1058._12_4_;
            local_1048 = vaddps_avx512vl(auVar61,auVar94);
            auVar17._8_4_ = 0x7fffffff;
            auVar17._0_8_ = 0x7fffffff7fffffff;
            auVar17._12_4_ = 0x7fffffff;
            auVar43 = vandps_avx512vl(local_1048,auVar17);
            auVar18._8_4_ = 0x34000000;
            auVar18._0_8_ = 0x3400000034000000;
            auVar18._12_4_ = 0x34000000;
            auVar53 = vmulps_avx512vl(auVar43,auVar18);
            auVar42 = vminps_avx512vl(local_1068,local_1058);
            auVar42 = vminps_avx512vl(auVar42,auVar61);
            auVar19._8_4_ = 0x80000000;
            auVar19._0_8_ = 0x8000000080000000;
            auVar19._12_4_ = 0x80000000;
            auVar54 = vxorps_avx512vl(auVar53,auVar19);
            uVar13 = vcmpps_avx512vl(auVar42,auVar54,5);
            auVar42 = vmaxps_avx512vl(local_1068,local_1058);
            auVar61 = vmaxps_avx512vl(auVar42,auVar61);
            uVar14 = vcmpps_avx512vl(auVar61,auVar53,2);
            local_1030 = ((byte)uVar13 | (byte)uVar14) & 0xf;
            if (local_1030 != 0) {
              auVar61 = vmulps_avx512vl(auVar40,auVar57);
              auVar53 = vmulps_avx512vl(auVar48,auVar58);
              auVar42 = vmulps_avx512vl(auVar49,auVar56);
              auVar54 = vmulps_avx512vl(auVar58,auVar60);
              auVar55 = vmulps_avx512vl(auVar56,auVar41);
              auVar52 = vmulps_avx512vl(auVar57,auVar59);
              auVar49 = vfmsub213ps_avx512vl(auVar49,auVar58,auVar61);
              auVar40 = vfmsub213ps_avx512vl(auVar40,auVar56,auVar53);
              auVar48 = vfmsub213ps_avx512vl(auVar48,auVar57,auVar42);
              auVar41 = vfmsub213ps_avx512vl(auVar41,auVar57,auVar54);
              auVar57 = vfmsub213ps_avx512vl(auVar59,auVar58,auVar55);
              auVar56 = vfmsub213ps_avx512vl(auVar60,auVar56,auVar52);
              auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar61 = vandps_avx512vl(auVar61,auVar58);
              auVar54 = vandps_avx512vl(auVar54,auVar58);
              uVar29 = vcmpps_avx512vl(auVar61,auVar54,1);
              auVar61 = vandps_avx512vl(auVar53,auVar58);
              auVar53 = vandps_avx512vl(auVar55,auVar58);
              uVar31 = vcmpps_avx512vl(auVar61,auVar53,1);
              auVar61 = vandps_avx512vl(auVar42,auVar58);
              auVar53 = vandps_avx512vl(auVar52,auVar58);
              uVar33 = vcmpps_avx512vl(auVar61,auVar53,1);
              bVar5 = (bool)((byte)uVar29 & 1);
              local_ff8._0_4_ = (uint)bVar5 * auVar49._0_4_ | (uint)!bVar5 * auVar41._0_4_;
              bVar5 = (bool)((byte)(uVar29 >> 1) & 1);
              local_ff8._4_4_ = (uint)bVar5 * auVar49._4_4_ | (uint)!bVar5 * auVar41._4_4_;
              bVar5 = (bool)((byte)(uVar29 >> 2) & 1);
              local_ff8._8_4_ = (uint)bVar5 * auVar49._8_4_ | (uint)!bVar5 * auVar41._8_4_;
              bVar5 = (bool)((byte)(uVar29 >> 3) & 1);
              local_ff8._12_4_ = (uint)bVar5 * auVar49._12_4_ | (uint)!bVar5 * auVar41._12_4_;
              bVar5 = (bool)((byte)uVar31 & 1);
              local_fe8._0_4_ = (uint)bVar5 * auVar40._0_4_ | (uint)!bVar5 * auVar57._0_4_;
              bVar5 = (bool)((byte)(uVar31 >> 1) & 1);
              local_fe8._4_4_ = (uint)bVar5 * auVar40._4_4_ | (uint)!bVar5 * auVar57._4_4_;
              bVar5 = (bool)((byte)(uVar31 >> 2) & 1);
              local_fe8._8_4_ = (uint)bVar5 * auVar40._8_4_ | (uint)!bVar5 * auVar57._8_4_;
              bVar5 = (bool)((byte)(uVar31 >> 3) & 1);
              local_fe8._12_4_ = (uint)bVar5 * auVar40._12_4_ | (uint)!bVar5 * auVar57._12_4_;
              bVar5 = (bool)((byte)uVar33 & 1);
              local_fd8[0] = (float)((uint)bVar5 * auVar48._0_4_ | (uint)!bVar5 * auVar56._0_4_);
              bVar5 = (bool)((byte)(uVar33 >> 1) & 1);
              local_fd8[1] = (float)((uint)bVar5 * auVar48._4_4_ | (uint)!bVar5 * auVar56._4_4_);
              bVar5 = (bool)((byte)(uVar33 >> 2) & 1);
              local_fd8[2] = (float)((uint)bVar5 * auVar48._8_4_ | (uint)!bVar5 * auVar56._8_4_);
              bVar5 = (bool)((byte)(uVar33 >> 3) & 1);
              local_fd8[3] = (float)((uint)bVar5 * auVar48._12_4_ | (uint)!bVar5 * auVar56._12_4_);
              auVar88._0_4_ = fVar86 * local_fd8[0];
              auVar88._4_4_ = fVar86 * local_fd8[1];
              auVar88._8_4_ = fVar86 * local_fd8[2];
              auVar88._12_4_ = fVar86 * local_fd8[3];
              auVar40 = vfmadd213ps_fma(auVar83,local_fe8,auVar88);
              auVar40 = vfmadd213ps_fma(auVar81,local_ff8,auVar40);
              auVar82._0_4_ = auVar40._0_4_ + auVar40._0_4_;
              auVar82._4_4_ = auVar40._4_4_ + auVar40._4_4_;
              auVar82._8_4_ = auVar40._8_4_ + auVar40._8_4_;
              auVar82._12_4_ = auVar40._12_4_ + auVar40._12_4_;
              auVar84._0_4_ = auVar51._0_4_ * local_fd8[0];
              auVar84._4_4_ = auVar51._4_4_ * local_fd8[1];
              auVar84._8_4_ = auVar51._8_4_ * local_fd8[2];
              auVar84._12_4_ = auVar51._12_4_ * local_fd8[3];
              auVar40 = vfmadd213ps_fma(auVar50,local_fe8,auVar84);
              auVar40 = vfmadd213ps_fma(auVar44,local_ff8,auVar40);
              auVar44 = vrcp14ps_avx512vl(auVar82);
              auVar61 = auVar97._0_16_;
              auVar41 = vfnmadd213ps_avx512vl(auVar44,auVar82,auVar61);
              auVar44 = vfmadd132ps_fma(auVar41,auVar44,auVar44);
              local_1008._0_4_ = auVar44._0_4_ * (auVar40._0_4_ + auVar40._0_4_);
              local_1008._4_4_ = auVar44._4_4_ * (auVar40._4_4_ + auVar40._4_4_);
              local_1008._8_4_ = auVar44._8_4_ * (auVar40._8_4_ + auVar40._8_4_);
              local_1008._12_4_ = auVar44._12_4_ * (auVar40._12_4_ + auVar40._12_4_);
              auVar74 = ZEXT1664(local_1008);
              uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar20._4_4_ = uVar76;
              auVar20._0_4_ = uVar76;
              auVar20._8_4_ = uVar76;
              auVar20._12_4_ = uVar76;
              uVar13 = vcmpps_avx512vl(local_1008,auVar20,0xd);
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar44 = vxorps_avx512vl(auVar82,auVar21);
              fVar86 = (ray->super_RayK<1>).tfar;
              auVar22._4_4_ = fVar86;
              auVar22._0_4_ = fVar86;
              auVar22._8_4_ = fVar86;
              auVar22._12_4_ = fVar86;
              uVar14 = vcmpps_avx512vl(local_1008,auVar22,2);
              uVar15 = vcmpps_avx512vl(auVar82,auVar44,4);
              local_1030 = (byte)uVar13 & (byte)uVar14 & (byte)uVar15 & local_1030;
              if (local_1030 != 0) {
                auVar3._0_4_ = (ray->super_RayK<1>).tfar;
                auVar3._4_4_ = (ray->super_RayK<1>).mask;
                auVar3._8_4_ = (ray->super_RayK<1>).id;
                auVar3._12_4_ = (ray->super_RayK<1>).flags;
                auVar75 = ZEXT1664(auVar3);
                uVar30 = vextractps_avx(auVar3,1);
                local_1170 = local_1170 + uVar39;
                local_1038 = &local_1199;
                auVar23._8_4_ = 0x219392ef;
                auVar23._0_8_ = 0x219392ef219392ef;
                auVar23._12_4_ = 0x219392ef;
                uVar29 = vcmpps_avx512vl(auVar43,auVar23,5);
                auVar44 = vrcp14ps_avx512vl(local_1048);
                auVar40 = vfnmadd213ps_avx512vl(local_1048,auVar44,auVar61);
                auVar44 = vfmadd132ps_avx512vl(auVar40,auVar44,auVar44);
                fVar67 = (float)((uint)((byte)uVar29 & 1) * auVar44._0_4_);
                fVar90 = (float)((uint)((byte)(uVar29 >> 1) & 1) * auVar44._4_4_);
                fVar89 = (float)((uint)((byte)(uVar29 >> 2) & 1) * auVar44._8_4_);
                fVar86 = (float)((uint)((byte)(uVar29 >> 3) & 1) * auVar44._12_4_);
                auVar70._0_4_ = fVar67 * local_1068._0_4_;
                auVar70._4_4_ = fVar90 * local_1068._4_4_;
                auVar70._8_4_ = fVar89 * local_1068._8_4_;
                auVar70._12_4_ = fVar86 * local_1068._12_4_;
                local_1028 = vminps_avx512vl(auVar70,auVar61);
                auVar71._0_4_ = fVar67 * local_1058._0_4_;
                auVar71._4_4_ = fVar90 * local_1058._4_4_;
                auVar71._8_4_ = fVar89 * local_1058._8_4_;
                auVar71._12_4_ = fVar86 * local_1058._12_4_;
                local_1018 = vminps_avx512vl(auVar71,auVar61);
                local_1150 = local_1188->scene;
                auVar72._8_4_ = 0x7f800000;
                auVar72._0_8_ = 0x7f8000007f800000;
                auVar72._12_4_ = 0x7f800000;
                auVar44 = vblendmps_avx512vl(auVar72,local_1008);
                auVar65._0_4_ =
                     (uint)(local_1030 & 1) * auVar44._0_4_ |
                     (uint)!(bool)(local_1030 & 1) * 0x7f800000;
                bVar5 = (bool)(local_1030 >> 1 & 1);
                auVar65._4_4_ = (uint)bVar5 * auVar44._4_4_ | (uint)!bVar5 * 0x7f800000;
                bVar5 = (bool)(local_1030 >> 2 & 1);
                auVar65._8_4_ = (uint)bVar5 * auVar44._8_4_ | (uint)!bVar5 * 0x7f800000;
                auVar65._12_4_ =
                     (uint)(local_1030 >> 3) * auVar44._12_4_ |
                     (uint)!(bool)(local_1030 >> 3) * 0x7f800000;
                auVar44 = vshufps_avx(auVar65,auVar65,0xb1);
                auVar44 = vminps_avx(auVar44,auVar65);
                auVar40 = vshufpd_avx(auVar44,auVar44,1);
                auVar44 = vminps_avx(auVar40,auVar44);
                uVar13 = vcmpps_avx512vl(auVar65,auVar44,0);
                local_11a0 = (uint)local_1030;
                bVar27 = local_1030;
                if (((byte)uVar13 & local_1030) != 0) {
                  bVar27 = (byte)uVar13 & local_1030;
                }
                uVar28 = 0;
                for (uVar25 = (uint)bVar27; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x80000000) {
                  uVar28 = uVar28 + 1;
                }
                do {
                  uVar25 = uVar28 & 0xff;
                  local_1178 = (ulong)uVar25;
                  local_10f0 = *(uint *)(local_1170 + 0x120 + local_1178 * 4);
                  local_1190 = (local_1150->geometries).items[local_10f0].ptr;
                  if ((local_1190->mask & uVar30) == 0) {
                    bVar27 = ~(byte)(1 << (uVar28 & 0x1f)) & (byte)local_11a0;
                  }
                  else {
                    local_1180 = local_1188->args;
                    local_10d8 = auVar75._0_16_;
                    if (local_1180->filter == (RTCFilterFunctionN)0x0) {
                      local_1138.context = local_1188->user;
                      if (local_1190->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar29 = (ulong)(uVar25 << 2);
                        fVar86 = *(float *)(local_1028 + uVar29);
                        fVar89 = *(float *)(local_1018 + uVar29);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1008 + uVar29);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_ff8 + uVar29);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_fe8 + uVar29);
                        (ray->Ng).field_0.field_0.z = *(float *)((long)local_fd8 + uVar29);
                        ray->u = fVar86;
                        ray->v = fVar89;
                        ray->primID = *(uint *)(local_1170 + 0x130 + uVar29);
                        ray->geomID = local_10f0;
                        ray->instID[0] = (local_1138.context)->instID[0];
                        ray->instPrimID[0] = (local_1138.context)->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      local_1138.context = local_1188->user;
                    }
                    uVar29 = (ulong)(uVar25 * 4);
                    local_1108 = *(float *)(local_ff8 + uVar29);
                    local_1104 = *(undefined4 *)(local_fe8 + uVar29);
                    local_1100 = *(undefined4 *)((long)local_fd8 + uVar29);
                    local_10fc = *(undefined4 *)(local_1028 + uVar29);
                    local_10f8 = *(undefined4 *)(local_1018 + uVar29);
                    local_10f4 = *(undefined4 *)(local_1170 + 0x130 + uVar29);
                    local_10ec = (local_1138.context)->instID[0];
                    local_10e8 = (local_1138.context)->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_1008 + uVar29);
                    local_1164 = -1;
                    local_1138.valid = &local_1164;
                    local_1138.geometryUserPtr = local_1190->userPtr;
                    local_1138.ray = (RTCRayN *)ray;
                    local_1138.hit = (RTCHitN *)&local_1108;
                    local_1138.N = 1;
                    local_1078 = auVar74._0_16_;
                    if (local_1190->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01ea7976:
                      if ((local_1180->filter != (RTCFilterFunctionN)0x0) &&
                         (((local_1180->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_1190->field_8).field_0x2 & 0x40) != 0)))) {
                        (*local_1180->filter)(&local_1138);
                        auVar74 = ZEXT1664(local_1078);
                        auVar102 = ZEXT1664(local_10c8);
                        auVar101 = ZEXT1664(local_10b8);
                        auVar100 = ZEXT1664(local_10a8);
                        auVar99 = ZEXT1664(local_1098);
                        auVar98 = ZEXT1664(local_1088);
                        auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar97 = ZEXT1664(auVar44);
                        uVar34 = local_1198;
                        uVar35 = local_1158;
                        uVar36 = local_1160;
                        if (*local_1138.valid == 0) goto LAB_01ea7a54;
                      }
                      (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1138.hit;
                      (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1138.hit + 4);
                      (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1138.hit + 8);
                      *(float *)((long)local_1138.ray + 0x3c) = *(float *)(local_1138.hit + 0xc);
                      *(float *)((long)local_1138.ray + 0x40) = *(float *)(local_1138.hit + 0x10);
                      *(float *)((long)local_1138.ray + 0x44) = *(float *)(local_1138.hit + 0x14);
                      *(float *)((long)local_1138.ray + 0x48) = *(float *)(local_1138.hit + 0x18);
                      *(float *)((long)local_1138.ray + 0x4c) = *(float *)(local_1138.hit + 0x1c);
                      *(float *)((long)local_1138.ray + 0x50) = *(float *)(local_1138.hit + 0x20);
                    }
                    else {
                      (*local_1190->intersectionFilterN)(&local_1138);
                      auVar74 = ZEXT1664(local_1078);
                      auVar102 = ZEXT1664(local_10c8);
                      auVar101 = ZEXT1664(local_10b8);
                      auVar100 = ZEXT1664(local_10a8);
                      auVar99 = ZEXT1664(local_1098);
                      auVar98 = ZEXT1664(local_1088);
                      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar97 = ZEXT1664(auVar44);
                      uVar34 = local_1198;
                      uVar35 = local_1158;
                      uVar36 = local_1160;
                      if (*local_1138.valid != 0) goto LAB_01ea7976;
LAB_01ea7a54:
                      (ray->super_RayK<1>).tfar = (float)local_10d8._0_4_;
                      uVar34 = local_1198;
                      uVar35 = local_1158;
                      uVar36 = local_1160;
                    }
                    auVar4._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar4._4_4_ = (ray->super_RayK<1>).mask;
                    auVar4._8_4_ = (ray->super_RayK<1>).id;
                    auVar4._12_4_ = (ray->super_RayK<1>).flags;
                    auVar75 = ZEXT1664(auVar4);
                    fVar86 = (ray->super_RayK<1>).tfar;
                    auVar24._4_4_ = fVar86;
                    auVar24._0_4_ = fVar86;
                    auVar24._8_4_ = fVar86;
                    auVar24._12_4_ = fVar86;
                    uVar13 = vcmpps_avx512vl(auVar74._0_16_,auVar24,2);
                    bVar27 = ~(byte)(1 << ((uint)local_1178 & 0x1f)) & (byte)local_11a0 &
                             (byte)uVar13;
                    uVar30 = vextractps_avx(auVar4,1);
                  }
                  local_11a0 = (uint)bVar27;
                  if (bVar27 == 0) break;
                  auVar73._8_4_ = 0x7f800000;
                  auVar73._0_8_ = 0x7f8000007f800000;
                  auVar73._12_4_ = 0x7f800000;
                  auVar44 = vblendmps_avx512vl(auVar73,auVar74._0_16_);
                  auVar66._0_4_ =
                       (uint)(bVar27 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar27 & 1) * 0x7f800000;
                  bVar5 = (bool)(bVar27 >> 1 & 1);
                  auVar66._4_4_ = (uint)bVar5 * auVar44._4_4_ | (uint)!bVar5 * 0x7f800000;
                  bVar5 = (bool)(bVar27 >> 2 & 1);
                  auVar66._8_4_ = (uint)bVar5 * auVar44._8_4_ | (uint)!bVar5 * 0x7f800000;
                  auVar66._12_4_ =
                       (uint)(bVar27 >> 3) * auVar44._12_4_ |
                       (uint)!(bool)(bVar27 >> 3) * 0x7f800000;
                  auVar44 = vshufps_avx(auVar66,auVar66,0xb1);
                  auVar44 = vminps_avx(auVar44,auVar66);
                  auVar40 = vshufpd_avx(auVar44,auVar44,1);
                  auVar44 = vminps_avx(auVar40,auVar44);
                  uVar13 = vcmpps_avx512vl(auVar66,auVar44,0);
                  bVar27 = (byte)uVar13 & bVar27;
                  uVar25 = local_11a0;
                  if (bVar27 != 0) {
                    uVar25 = (uint)bVar27;
                  }
                  uVar28 = 0;
                  for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x80000000) {
                    uVar28 = uVar28 + 1;
                  }
                } while( true );
              }
            }
            local_1140 = local_1140 + 1;
          } while (local_1140 != local_1148);
        }
        fVar86 = (ray->super_RayK<1>).tfar;
        auVar74 = ZEXT1664(CONCAT412(fVar86,CONCAT48(fVar86,CONCAT44(fVar86,fVar86))));
        auVar75 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar85 = ZEXT1664(local_f88);
        auVar91 = ZEXT1664(local_fa8);
        auVar95 = ZEXT1664(local_fb8);
        auVar96 = ZEXT1664(local_fc8);
        fVar86 = local_f98;
        fVar89 = fStack_f94;
        fVar90 = fStack_f90;
        fVar67 = fStack_f8c;
      }
    } while (puVar26 != &local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }